

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_trap_expr_xtra(parser *p)

{
  long *plVar1;
  int16_t iVar2;
  int iVar3;
  void *pvVar4;
  long *plVar5;
  char *name;
  char *name_00;
  char *string;
  expression_t *expression;
  expression_base_value_f function;
  parser_error pVar6;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    plVar1 = *(long **)((long)pvVar4 + 0x80);
    pVar6 = PARSE_ERROR_NONE;
    if (*(long **)((long)pvVar4 + 0x80) != (long *)0x0) {
      do {
        plVar5 = plVar1;
        plVar1 = (long *)*plVar5;
      } while ((long *)*plVar5 != (long *)0x0);
      pVar6 = PARSE_ERROR_NONE;
      if (plVar5[2] != 0) {
        name = parser_getsym(p,"name");
        name_00 = parser_getsym(p,"base");
        string = parser_getstr(p,"expr");
        expression = expression_new();
        if (expression == (expression_t *)0x0) {
          pVar6 = PARSE_ERROR_INVALID_EXPRESSION;
        }
        else {
          function = effect_value_base_by_name(name_00);
          expression_set_base_value(expression,function);
          iVar2 = expression_add_operations_string(expression,string);
          if (iVar2 < 0) {
            pVar6 = PARSE_ERROR_BAD_EXPRESSION_STRING;
          }
          else {
            iVar3 = dice_bind_expression((dice_t *)plVar5[2],name,expression);
            pVar6 = iVar3 >> 0x1f & PARSE_ERROR_UNBOUND_EXPRESSION;
          }
          expression_free(expression);
        }
      }
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_trap_expr_xtra(struct parser *p) {
	struct trap_kind *t = parser_priv(p);
	struct effect *effect;
	expression_t *expression;
	expression_base_value_f function;
	const char *name;
	const char *base;
	const char *expr;
	enum parser_error result;

	if (!t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	/* If there is no effect, assume that this is human and not parser error. */
	effect = t->effect_xtra;
	if (effect == NULL) {
		return PARSE_ERROR_NONE;
	}
	while (effect->next) effect = effect->next;

	/* If there are no dice, assume that this is human and not parser error. */
	if (effect->dice == NULL) {
		return PARSE_ERROR_NONE;
	}
	name = parser_getsym(p, "name");
	base = parser_getsym(p, "base");
	expr = parser_getstr(p, "expr");
	expression = expression_new();

	if (expression == NULL) {
		return PARSE_ERROR_INVALID_EXPRESSION;
	}
	function = effect_value_base_by_name(base);
	expression_set_base_value(expression, function);

	if (expression_add_operations_string(expression, expr) < 0) {
		result = PARSE_ERROR_BAD_EXPRESSION_STRING;
	} else if (dice_bind_expression(effect->dice, name, expression) < 0) {
		result = PARSE_ERROR_UNBOUND_EXPRESSION;
	} else {
		result = PARSE_ERROR_NONE;
	}

	/* The dice object makes a deep copy of the expression, so we can free it */
	expression_free(expression);

	return result;
}